

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb2Image.c
# Opt level: O3

DdNode * Llb_ImgComputeImage(Aig_Man_t *pAig,Vec_Ptr_t *vDdMans,DdManager *dd,DdNode *bInit,
                            Vec_Ptr_t *vQuant0,Vec_Ptr_t *vQuant1,Vec_Int_t *vDriRefs,
                            abctime TimeTarget,int fBackward,int fReorder,int fVerbose)

{
  DdManager *ddSource;
  int iVar1;
  uint uVar2;
  uint uVar3;
  DdNode *pDVar4;
  DdNode *n;
  DdNode *n_00;
  DdNode *pDVar5;
  long lVar6;
  int iVar7;
  ulong uVar8;
  timespec local_70;
  Vec_Ptr_t *local_60;
  long local_58;
  long local_50;
  Vec_Ptr_t *local_48;
  Vec_Ptr_t *local_40;
  ulong local_38;
  
  local_40 = vQuant1;
  iVar1 = clock_gettime(3,&local_70);
  if (iVar1 < 0) {
    local_58 = 1;
  }
  else {
    lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
    local_58 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_70.tv_sec * -1000000;
  }
  Cudd_Ref(bInit);
  if (fBackward == 0) {
    if (vQuant0->nSize < 1) goto LAB_0082fb0b;
    pDVar4 = Llb_ImgComputeCube(pAig,(Vec_Int_t *)*vQuant0->pArray,dd);
    Cudd_Ref(pDVar4);
    n = Cudd_bddExistAbstract(dd,bInit,pDVar4);
    if (n == (DdNode *)0x0) {
      Cudd_RecursiveDeref(dd,bInit);
LAB_0082fa97:
      Cudd_RecursiveDeref(dd,pDVar4);
      return (DdNode *)0x0;
    }
  }
  else {
    pDVar4 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
    Cudd_Ref(pDVar4);
    n = Extra_bddChangePolarity(dd,bInit,pDVar4);
  }
  Cudd_Ref(n);
  local_48 = vQuant0;
  Cudd_RecursiveDeref(dd,bInit);
  Cudd_RecursiveDeref(dd,pDVar4);
  if (0 < vDdMans->nSize) {
    uVar8 = 0;
    pDVar5 = n;
    local_60 = vDdMans;
    do {
      ddSource = (DdManager *)vDdMans->pArray[uVar8];
      iVar1 = clock_gettime(3,&local_70);
      if (iVar1 < 0) {
        lVar6 = 1;
      }
      else {
        lVar6 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_70.tv_nsec),8);
        lVar6 = ((lVar6 >> 7) - (lVar6 >> 0x3f)) + local_70.tv_sec * -1000000;
      }
      if (fVerbose != 0) {
        printf("   %2d : ",uVar8 & 0xffffffff);
      }
      pDVar4 = Cudd_bddTransfer(ddSource,dd,ddSource->bFunc);
      if (pDVar4 == (DdNode *)0x0) {
        return (DdNode *)0x0;
      }
      Cudd_Ref(pDVar4);
      if (fVerbose != 0) {
        uVar2 = Cudd_DagSize(ddSource->bFunc);
        uVar3 = Cudd_DagSize(pDVar4);
        printf("Pt0 =%6d. Pt1 =%6d. ",(ulong)uVar2,(ulong)uVar3);
      }
      local_38 = uVar8 + 1;
      if ((long)local_40->nSize <= (long)local_38) goto LAB_0082fb0b;
      n_00 = Llb_ImgComputeCube(pAig,(Vec_Int_t *)local_40->pArray[uVar8 + 1],dd);
      Cudd_Ref(n_00);
      n = Cudd_bddAndAbstract(dd,pDVar5,pDVar4,n_00);
      if (n == (DdNode *)0x0) {
        Cudd_RecursiveDeref(dd,pDVar5);
        Cudd_RecursiveDeref(dd,n_00);
        goto LAB_0082fa97;
      }
      Cudd_Ref(n);
      if (fVerbose == 0) {
        Cudd_RecursiveDeref(dd,pDVar5);
        Cudd_RecursiveDeref(dd,n_00);
        Cudd_RecursiveDeref(dd,pDVar4);
        vDdMans = local_60;
      }
      else {
        local_50 = lVar6;
        uVar2 = Cudd_DagSize(pDVar5);
        uVar3 = Cudd_DagSize(n);
        printf("Im0 =%6d. Im1 =%6d. ",(ulong)uVar2,(ulong)uVar3);
        Cudd_RecursiveDeref(dd,pDVar5);
        Cudd_RecursiveDeref(dd,n_00);
        Cudd_RecursiveDeref(dd,pDVar4);
        uVar2 = Cudd_SupportSize(dd,n);
        printf("Supp =%3d. ",(ulong)uVar2);
        iVar7 = 3;
        iVar1 = clock_gettime(3,&local_70);
        vDdMans = local_60;
        if (iVar1 < 0) {
          lVar6 = -1;
        }
        else {
          lVar6 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
        }
        lVar6 = lVar6 + local_50;
        Abc_Print(iVar7,"%s =","T");
        Abc_Print(iVar7,"%9.2f sec\n",(double)lVar6 / 1000000.0);
      }
      uVar8 = local_38;
      pDVar5 = n;
    } while ((long)local_38 < (long)vDdMans->nSize);
  }
  if (fBackward == 0) {
    pDVar4 = Llb_DriverPhaseCube(pAig,vDriRefs,dd);
    Cudd_Ref(pDVar4);
    pDVar5 = Extra_bddChangePolarity(dd,n,pDVar4);
  }
  else {
    if (local_48->nSize < 1) {
LAB_0082fb0b:
      __assert_fail("i >= 0 && i < p->nSize",
                    "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                    ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
    }
    pDVar4 = Llb_ImgComputeCube(pAig,(Vec_Int_t *)*local_48->pArray,dd);
    Cudd_Ref(pDVar4);
    pDVar5 = Cudd_bddExistAbstract(dd,n,pDVar4);
  }
  Cudd_Ref(pDVar5);
  Cudd_RecursiveDeref(dd,n);
  Cudd_RecursiveDeref(dd,pDVar4);
  if (fReorder != 0) {
    if (fVerbose == 0) {
      Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
    }
    else {
      pDVar4 = pDVar5;
      uVar2 = Cudd_DagSize(pDVar5);
      Abc_Print((int)pDVar4,"        Reordering... Before =%5d. ",(ulong)uVar2);
      Cudd_ReduceHeap(dd,CUDD_REORDER_SYMM_SIFT,100);
      pDVar4 = pDVar5;
      uVar2 = Cudd_DagSize(pDVar5);
      Abc_Print((int)pDVar4,"After =%5d. ",(ulong)uVar2);
      iVar7 = 3;
      iVar1 = clock_gettime(3,&local_70);
      if (iVar1 < 0) {
        lVar6 = -1;
      }
      else {
        lVar6 = local_70.tv_nsec / 1000 + local_70.tv_sec * 1000000;
      }
      lVar6 = lVar6 + local_58;
      Abc_Print(iVar7,"%s =","Time");
      Abc_Print(iVar7,"%9.2f sec\n",(double)lVar6 / 1000000.0);
    }
  }
  Cudd_Deref(pDVar5);
  return pDVar5;
}

Assistant:

DdNode * Llb_ImgComputeImage( Aig_Man_t * pAig, Vec_Ptr_t * vDdMans, DdManager * dd, DdNode * bInit, 
    Vec_Ptr_t * vQuant0, Vec_Ptr_t * vQuant1, Vec_Int_t * vDriRefs, 
    abctime TimeTarget, int fBackward, int fReorder, int fVerbose )
{
//    int fCheckSupport = 0;
    DdManager * ddPart;
    DdNode * bImage, * bGroup, * bCube, * bTemp;
    int i;
    abctime clk, clk0 = Abc_Clock();

    bImage = bInit;  Cudd_Ref( bImage );
    if ( fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            return NULL;
        }
        Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    // perform image computation
    Vec_PtrForEachEntry( DdManager *, vDdMans, ddPart, i )
    {
        clk = Abc_Clock();
if ( fVerbose )
printf( "   %2d : ", i );
        // transfer the BDD from the group manager to the main manager
        bGroup = Cudd_bddTransfer( ddPart, dd, ddPart->bFunc );                           
        if ( bGroup == NULL )
            return NULL;
        Cudd_Ref( bGroup );
if ( fVerbose )
printf( "Pt0 =%6d. Pt1 =%6d. ", Cudd_DagSize(ddPart->bFunc), Cudd_DagSize(bGroup) );
        // perform partial product
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant1, i+1), dd ); Cudd_Ref( bCube );
//        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );                
//        bImage = Extra_bddAndAbstractTime( dd, bTemp = bImage, bGroup, bCube, TimeTarget );  
        bImage = Cudd_bddAndAbstract( dd, bTemp = bImage, bGroup, bCube );  
        if ( bImage == NULL )
        {
            Cudd_RecursiveDeref( dd, bTemp );
            Cudd_RecursiveDeref( dd, bCube );
            Cudd_RecursiveDeref( dd, bGroup );
            return NULL;
        }
        Cudd_Ref( bImage );

if ( fVerbose )
printf( "Im0 =%6d. Im1 =%6d. ", Cudd_DagSize(bTemp), Cudd_DagSize(bImage) );
//printf("\n"); Extra_bddPrintSupport(dd, bImage); printf("\n");
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
        Cudd_RecursiveDeref( dd, bGroup );

//        Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//        Abc_Print( 1, "Reo =%6d.  ", Cudd_DagSize(bImage) );

if ( fVerbose )
printf( "Supp =%3d. ", Cudd_SupportSize(dd, bImage) );
if ( fVerbose )
Abc_PrintTime( 1, "T", Abc_Clock() - clk );
    }

    if ( !fBackward )
    {
        // change polarity
        bCube  = Llb_DriverPhaseCube( pAig, vDriRefs, dd );                Cudd_Ref( bCube );
        bImage = Extra_bddChangePolarity( dd, bTemp = bImage, bCube );     Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }
    else
    {
        // quantify unique vriables
        bCube  = Llb_ImgComputeCube( pAig, (Vec_Int_t *)Vec_PtrEntry(vQuant0, 0), dd ); Cudd_Ref( bCube );
        bImage = Cudd_bddExistAbstract( dd, bTemp = bImage, bCube );                    Cudd_Ref( bImage );
        Cudd_RecursiveDeref( dd, bTemp );
        Cudd_RecursiveDeref( dd, bCube );
    }

    if ( fReorder )
    {
    if ( fVerbose )
    Abc_Print( 1, "        Reordering... Before =%5d. ", Cudd_DagSize(bImage) );
    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
    if ( fVerbose )
    Abc_Print( 1, "After =%5d. ", Cudd_DagSize(bImage) );
//    Cudd_ReduceHeap( dd, CUDD_REORDER_SYMM_SIFT, 100 );
//    Abc_Print( 1, "After =%5d.  ", Cudd_DagSize(bImage) );
    if ( fVerbose )
    Abc_PrintTime( 1, "Time", Abc_Clock() - clk0 );
//    Abc_Print( 1, "\n" );
    }

    Cudd_Deref( bImage );
    return bImage;
}